

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viplanner.cpp
# Opt level: O2

int __thiscall
VIPlanner::replan(VIPlanner *this,double allocatedtime,
                 vector<int,_std::allocator<int>_> *solution_stateIDs_V)

{
  int *piVar1;
  clock_t cVar2;
  clock_t cVar3;
  
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1f])();
  cVar2 = clock();
  while( true ) {
    cVar3 = clock();
    if ((allocatedtime <= (double)(cVar3 - cVar2) / 1000000.0) || (g_belldelta <= 0.01)) break;
    piVar1 = &(this->viPlanner).iteration;
    *piVar1 = *piVar1 + 1;
    g_belldelta = 0.0;
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1e])(this);
    if ((this->viPlanner).iteration % 100 == 0) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,_stdout,cVar2);
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,1,cVar2);
    }
  }
  clock();
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,_stdout,cVar2);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,1,cVar2);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1b])(this,1);
  return 1;
}

Assistant:

int VIPlanner::replan(double allocatedtime, vector<int>* solution_stateIDs_V)
{
#ifndef ROS
    const char* policy = "policy.txt";
    const char* stat = "stat.txt";
#endif
    FILE* fPolicy = SBPL_FOPEN(policy, "w");
    FILE* fStat = SBPL_FOPEN(stat, "w");

    //initialization
    InitializePlanner();

    //start the timer
    clock_t starttime = clock();

    //--------------iterate-------------------------------
    while (((clock() - starttime) / (double)CLOCKS_PER_SEC) < allocatedtime && g_belldelta > MDP_ERRDELTA) {
        viPlanner.iteration++;

        g_belldelta = 0;
        perform_iteration_forward();

        if (viPlanner.iteration % 100 == 0) {
            PrintStat(stdout, starttime);
            PrintStat(fStat, starttime);
        }
    }
    //------------------------------------------------------------------

    g_runtime = clock() - starttime;

    PrintStat(stdout, starttime);
    PrintStat(fStat, starttime);
    SBPL_FFLUSH(fStat);

    PrintPolicy(fPolicy);

    SBPL_FCLOSE(fPolicy);
    SBPL_FCLOSE(fStat);

    return 1;
}